

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationUtil.cpp
# Opt level: O1

VkMemoryBarrier *
vkt::synchronization::makeMemoryBarrier
          (VkMemoryBarrier *__return_storage_ptr__,VkAccessFlags srcAccessMask,
          VkAccessFlags dstAccessMask)

{
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_MEMORY_BARRIER;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->srcAccessMask = srcAccessMask;
  __return_storage_ptr__->dstAccessMask = dstAccessMask;
  return __return_storage_ptr__;
}

Assistant:

VkMemoryBarrier makeMemoryBarrier (const VkAccessFlags	srcAccessMask,
								   const VkAccessFlags	dstAccessMask)
{
	const VkMemoryBarrier barrier =
	{
		VK_STRUCTURE_TYPE_MEMORY_BARRIER,	// VkStructureType    sType;
		DE_NULL,							// const void*        pNext;
		srcAccessMask,						// VkAccessFlags      srcAccessMask;
		dstAccessMask,						// VkAccessFlags      dstAccessMask;
	};
	return barrier;
}